

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterRender.cpp
# Opt level: O1

void * FilterRender::doAuto(void *data,uint width,uint height)

{
  int iVar1;
  long *plVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  int i;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  ulong uVar13;
  int sum_2;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  int j;
  uint uVar19;
  long lVar20;
  int k_2;
  int i_2;
  long lVar21;
  int sum;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  
  uVar24 = (ulong)height;
  pvVar8 = operator_new__(uVar24 * 8);
  pvVar9 = operator_new__(uVar24 * 4);
  pvVar10 = operator_new__(uVar24 * 4);
  pvVar11 = operator_new__(uVar24);
  uVar23 = (ulong)width;
  if (height != 0) {
    uVar16 = 0;
    do {
      pvVar12 = operator_new__(uVar23 * 8);
      *(void **)((long)pvVar8 + uVar16 * 8) = pvVar12;
      if (width != 0) {
        uVar13 = 0;
        do {
          pvVar12 = operator_new__(4);
          *(void **)(*(long *)((long)pvVar8 + uVar16 * 8) + uVar13 * 8) = pvVar12;
          uVar13 = uVar13 + 1;
        } while (uVar23 != uVar13);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
    uVar16 = 0;
    pvVar12 = data;
    do {
      if (width != 0) {
        uVar13 = 0;
        do {
          lVar17 = 0;
          do {
            *(undefined1 *)(*(long *)(*(long *)((long)pvVar8 + uVar16 * 8) + uVar13 * 8) + lVar17) =
                 *(undefined1 *)((long)pvVar12 + lVar17);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          pvVar12 = (void *)((long)pvVar12 + 4);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar23);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
    uVar16 = 0;
    do {
      *(undefined4 *)((long)pvVar9 + uVar16 * 4) = 0;
      *(uint *)((long)pvVar10 + uVar16 * 4) = width;
      plVar2 = *(long **)((long)pvVar8 + uVar16 * 8);
      lVar17 = *plVar2;
      lVar20 = 0;
      do {
        lVar21 = 0;
        uVar22 = 0;
        do {
          iVar14 = (uint)*(byte *)(lVar17 + lVar21) - (uint)*(byte *)(plVar2[lVar20] + lVar21);
          bVar4 = (byte)iVar14;
          bVar6 = -bVar4;
          if (0 < iVar14) {
            bVar6 = bVar4;
          }
          uVar22 = uVar22 + bVar6;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
        if (0x1e < uVar22) goto LAB_00105f45;
        *(int *)((long)pvVar9 + uVar16 * 4) = (int)lVar20;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 5);
      if ((ulong)(width - 5) != 0) {
        lVar17 = *(long *)((long)pvVar8 + uVar16 * 8);
        uVar13 = 0;
        do {
          lVar20 = 0;
          uVar22 = 0;
          do {
            uVar7 = (uint)*(byte *)(*(long *)(lVar17 + uVar13 * 8) + lVar20) -
                    (uint)*(byte *)(*(long *)(lVar17 + 0x28 + uVar13 * 8) + lVar20);
            uVar18 = -uVar7;
            if (0 < (int)uVar7) {
              uVar18 = uVar7;
            }
            uVar22 = uVar22 + (uVar18 & 0xff);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 4);
          if (0x1e < uVar22) break;
          *(int *)((long)pvVar9 + uVar16 * 4) = (int)uVar13;
          uVar13 = uVar13 + 1;
        } while (uVar13 != width - 5);
      }
      iVar14 = *(int *)((long)pvVar9 + uVar16 * 4);
      if (iVar14 <= (int)(width - 1)) {
        lVar17 = *(long *)((long)pvVar8 + uVar16 * 8);
        uVar5 = width - 1;
        uVar19 = width;
        do {
          uVar15 = uVar5;
          lVar20 = 0;
          uVar22 = 0;
          do {
            uVar7 = (uint)*(byte *)(*(long *)(lVar17 + (long)(int)uVar15 * 8) + lVar20) -
                    (uint)*(byte *)(*(long *)(lVar17 + (long)(int)(uVar19 - 6) * 8) + lVar20);
            uVar18 = -uVar7;
            if (0 < (int)uVar7) {
              uVar18 = uVar7;
            }
            uVar22 = uVar22 + (uVar18 & 0xff);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 4);
          if (0x1e < uVar22) break;
          *(uint *)((long)pvVar10 + uVar16 * 4) = uVar15;
          uVar5 = uVar15 - 1;
          uVar19 = uVar15;
        } while (iVar14 <= (int)(uVar15 - 1));
      }
LAB_00105f45:
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
    uVar16 = 0;
    do {
      *(bool *)((long)pvVar11 + uVar16) =
           *(int *)((long)pvVar10 + uVar16 * 4) <= *(int *)((long)pvVar9 + uVar16 * 4);
      uVar16 = uVar16 + 1;
    } while (uVar24 != uVar16);
    uVar22 = 0;
    do {
      lVar17 = (long)(int)uVar22;
      uVar18 = uVar22 + 1;
      if (uVar22 + 1 < height) {
        uVar18 = height;
      }
      iVar14 = *(int *)((long)pvVar9 + lVar17 * 4);
      lVar20 = 0;
      do {
        if (*(char *)((long)pvVar11 + lVar20 + lVar17) != '\0') {
          uVar18 = (int)lVar20 + uVar22;
          break;
        }
        iVar1 = *(int *)((long)pvVar9 + lVar20 * 4 + lVar17 * 4);
        if (iVar1 < iVar14) {
          iVar14 = iVar1;
        }
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 + uVar22 < height);
      if ((int)uVar22 < (int)uVar18) {
        do {
          if (*(char *)((long)pvVar11 + lVar17) == '\0') {
            *(int *)((long)pvVar9 + lVar17 * 4) = iVar14;
          }
          lVar17 = lVar17 + 1;
        } while ((int)uVar18 != lVar17);
      }
      uVar22 = uVar18 + 1;
    } while (uVar22 < height);
    uVar22 = 0;
    do {
      lVar17 = (long)(int)uVar22;
      uVar18 = uVar22 + 1;
      if (uVar22 + 1 < height) {
        uVar18 = height;
      }
      iVar14 = *(int *)((long)pvVar10 + lVar17 * 4);
      lVar20 = 0;
      do {
        if (*(char *)((long)pvVar11 + lVar20 + lVar17) != '\0') {
          uVar18 = (int)lVar20 + uVar22;
          break;
        }
        iVar1 = *(int *)((long)pvVar10 + lVar20 * 4 + lVar17 * 4);
        if (iVar14 < iVar1) {
          iVar14 = iVar1;
        }
        lVar20 = lVar20 + 1;
      } while ((int)lVar20 + uVar22 < height);
      if ((int)uVar22 < (int)uVar18) {
        do {
          if (*(char *)((long)pvVar11 + lVar17) == '\0') {
            *(int *)((long)pvVar10 + lVar17 * 4) = iVar14;
          }
          lVar17 = lVar17 + 1;
        } while ((int)uVar18 != lVar17);
      }
      uVar22 = uVar18 + 1;
    } while (uVar22 < height);
    uVar16 = 0;
    do {
      if (*(char *)((long)pvVar11 + uVar16) != '\x01') break;
      *(uint *)((long)pvVar9 + uVar16 * 4) = width;
      *(undefined4 *)((long)pvVar10 + uVar16 * 4) = 0;
      *(undefined1 *)((long)pvVar11 + uVar16) = 0;
      uVar16 = uVar16 + 1;
    } while (uVar24 != uVar16);
  }
  if (-1 < (int)(height - 1)) {
    lVar17 = (ulong)(height - 1) + 1;
    do {
      if (*(char *)((long)pvVar11 + lVar17 + -1) != '\x01') break;
      *(uint *)((long)pvVar9 + lVar17 * 4 + -4) = width;
      *(undefined4 *)((long)pvVar10 + lVar17 * 4 + -4) = 0;
      *(undefined1 *)((long)pvVar11 + lVar17 + -1) = 0;
      lVar20 = lVar17 + -1;
      bVar3 = 0 < lVar17;
      lVar17 = lVar20;
    } while (lVar20 != 0 && bVar3);
  }
  if (1 < height) {
    uVar16 = 1;
    do {
      if (*(char *)((long)pvVar11 + uVar16) == '\x01') {
        *(undefined4 *)((long)pvVar9 + uVar16 * 4) = *(undefined4 *)((long)pvVar9 + uVar16 * 4 + -4)
        ;
        *(undefined4 *)((long)pvVar10 + uVar16 * 4) =
             *(undefined4 *)((long)pvVar10 + uVar16 * 4 + -4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar24 != uVar16);
  }
  if (height != 0) {
    uVar16 = 0;
    do {
      if (0 < *(int *)((long)pvVar9 + uVar16 * 4)) {
        lVar17 = 0;
        do {
          lVar20 = 0;
          do {
            *(undefined1 *)(*(long *)(*(long *)((long)pvVar8 + uVar16 * 8) + lVar17 * 8) + lVar20) =
                 0xff;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 4);
          lVar17 = lVar17 + 1;
        } while (lVar17 < *(int *)((long)pvVar9 + uVar16 * 4));
      }
      iVar14 = width - 1;
      if (*(int *)((long)pvVar10 + uVar16 * 4) <= (int)(width - 1)) {
        do {
          lVar17 = 0;
          do {
            *(undefined1 *)
             (*(long *)(*(long *)((long)pvVar8 + uVar16 * 8) + (long)iVar14 * 8) + lVar17) = 0;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          iVar14 = iVar14 + -1;
        } while (*(int *)((long)pvVar10 + uVar16 * 4) <= iVar14);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
    uVar16 = 0;
    do {
      if (width != 0) {
        uVar13 = 0;
        do {
          lVar17 = 0;
          do {
            *(undefined1 *)((long)data + lVar17) =
                 *(undefined1 *)
                  (*(long *)(*(long *)((long)pvVar8 + uVar16 * 8) + uVar13 * 8) + lVar17);
            lVar17 = lVar17 + 1;
          } while (lVar17 != 4);
          data = (void *)((long)data + 4);
          uVar13 = uVar13 + 1;
        } while (uVar13 != uVar23);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar24);
  }
  operator_delete__(pvVar9);
}

Assistant:

void* FilterRender::doAuto(void *data, uint width, uint height) {
	unsigned char ***map;
	int *le;
	int *ri;
	bool *all;

	map = new unsigned char**[height];
	le = new int[height];
	ri = new int[height];
	all = new bool[height];

	for (int i = 0; i < height; i++) {
		map[i] = new unsigned char*[width];
		for (int j = 0; j < width; j++) {
			map[i][j] = new unsigned char[4];
		}
	}

	unsigned char * p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = *(p + k);
				// b g r a
			}
			p += 4;
		}
	}

	const int margin = 5;

	for (int i = 0; i < height; i++) {
		bool flag = true;
		le[i] = 0;
		ri[i] = width;
		for (int j = 0; j < margin; j++) {
			if (equal(map[i][0], map[i][j])) {
				le[i] = j;
			} else {
				flag = false;
				break;
			}
		}
		if (!flag) continue;
		for (int j = 0; j < width - margin; j++) {
			if (equal(map[i][j], map[i][j + margin])) {
				le[i] = j;
			} else {
				break;
			}
		}
		for (int j = width - 1; j >= le[i]; j--) {
			if (equal(map[i][j], map[i][j - margin])) {
				ri[i] = j;
			} else {
				break;
			}
		}
	}

	for (int i = 0; i < height; i++) {
		if (le[i] >= ri[i]) {
			all[i] = true;
		} else {
			all[i] = false;
		}
	}

	int i, j;
	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = le[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (le[j] < common) {
				common = le[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			le[k] = common;
		}
	}

	for (i = 0; i < height; i = j + 1) {
		j = i;
		int common = ri[i];
		for (; j < height; j ++) {
			if (all[j]) {
				break;
			}
			if (ri[j] > common) {
				common = ri[j];
			}
		}
		for (int k = i; k < j; k++) {
			if (all[k]) continue;
			ri[k] = common;
		}
	}

	for (int i = 0; i < height; i++) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;

	}

	for (int i = height - 1; i >= 0; i--) {
		if (!all[i]) break;
		le[i] = width;
		ri[i] = 0;
		all[i] = false;
	}

	for (int i = 1; i < height; i++) {
		if (all[i]) {
			le[i] = le[i - 1];
			ri[i] = ri[i - 1];
		}
	}

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < le[i]; j++) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 255;
			}
		}
		for (int j = width - 1; j >= ri[i]; j--) {
			for (int k = 0; k < 4; k++) {
				map[i][j][k] = 0;
			}
		}
	}

	p = (unsigned char*)data;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			for (int k = 0; k < 4; k++) {
				*(p + k) = map[i][j][k];
			}
			p += 4;
		}
	}

	delete [] le;
	delete [] ri;
	delete [] all;

	for (int i = 0; i < height; i++) {
		for (int j = 0; j < width; j++) {
			delete [] map[i][j];
		}
		delete [] map[i];
	}
	delete [] map;
	map = NULL;
}